

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_>::Restore
          (TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_> *this)

{
  TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this_00;
  
  this_00 = (TPZGeoElRefLess<pzgeom::TPZGeoPrism> *)operator_new(0x2b0);
  *(undefined ***)&this_00->super_TPZGeoEl = &PTR__TPZSavable_019117f0;
  TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess(this_00,&PTR_PTR_019110e0);
  *(undefined ***)&this_00->super_TPZGeoEl = &PTR__TPZGeoElement_01910de0;
  *(undefined4 *)&this_00[1].super_TPZGeoEl = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.field_0x4 = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fMesh = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fMesh + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fId = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fId + 4) = 0xffffffff;
  this_00[1].super_TPZGeoEl.fMatId = -1;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.field_0x1c = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fReference = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fReference + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fIndex = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fIndex + 4) = 0xffffffff;
  this_00[1].super_TPZGeoEl.fNumInterfaces = -1;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.field_0x3c = 0xffffffff;
  return (TPZSavable *)this_00;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }